

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::CopyInputEdges(S2Builder *this)

{
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *this_00;
  pointer *ppVVar1;
  Vector3<double> *__args;
  double dVar2;
  double dVar3;
  pointer pVVar4;
  iterator __position;
  pointer ppVar5;
  VType VVar6;
  InputEdge *e;
  pointer ppVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  double *ap;
  long lVar12;
  bool bVar13;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> sorted;
  vector<int,_std::allocator<int>_> vmap;
  allocator_type local_61;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  SortInputVertices(&local_60,this);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_61);
  this_00 = &this->sites_;
  pVVar4 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar4;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (this_00,((long)(this->input_vertices_).
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->input_vertices_).
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((long)local_60.
            super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60.
            super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar8 = ((long)local_60.
                   super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.
                   super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    uVar10 = 0;
    iVar9 = 0;
    do {
      pVVar4 = (this->input_vertices_).
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      __args = pVVar4 + local_60.
                        super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10].second;
      iVar11 = (int)((ulong)((long)__position._M_current -
                            (long)(this->sites_).
                                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_60.
               super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].second] = iVar11;
      iVar9 = iVar9 + 1;
      uVar10 = (ulong)iVar9;
      if (uVar10 < uVar8) {
        do {
          lVar12 = 0;
          do {
            dVar2 = *(double *)
                     ((long)pVVar4[local_60.
                                   super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar10].second].c_ +
                     lVar12);
            dVar3 = *(double *)((long)__args->c_ + lVar12);
            if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
            bVar13 = lVar12 != 0x10;
            lVar12 = lVar12 + 8;
          } while (bVar13);
          if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_60.
                   super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].second] = iVar11;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar8);
        iVar9 = (int)uVar10;
      }
      if (__position._M_current ==
          (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)this_00,__position,
                   __args);
      }
      else {
        (__position._M_current)->c_[2] = __args->c_[2];
        VVar6 = __args->c_[1];
        (__position._M_current)->c_[0] = __args->c_[0];
        (__position._M_current)->c_[1] = VVar6;
        ppVVar1 = &(this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      uVar10 = (ulong)iVar9;
      uVar8 = ((long)local_60.
                     super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_60.
                     super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    } while (uVar10 <= uVar8 && uVar8 - uVar10 != 0);
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator=
            (&this->input_vertices_,this_00);
  ppVar7 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar5 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar7 == ppVar5) {
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_001aa5d7;
  }
  else {
    do {
      ppVar7->first =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ppVar7->first];
      ppVar7->second =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ppVar7->second];
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar5);
  }
  operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_001aa5d7:
  if (local_60.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2Builder::CopyInputEdges() {
  // Sort the input vertices, discard duplicates, and update the input edges
  // to refer to the pruned vertex list.  (We sort in the same order used by
  // ChooseInitialSites() to avoid inconsistencies in tests.)
  vector<InputVertexKey> sorted = SortInputVertices();
  vector<InputVertexId> vmap(input_vertices_.size());
  sites_.clear();
  sites_.reserve(input_vertices_.size());
  for (int in = 0; in < sorted.size(); ) {
    const S2Point& site = input_vertices_[sorted[in].second];
    vmap[sorted[in].second] = sites_.size();
    while (++in < sorted.size() && input_vertices_[sorted[in].second] == site) {
      vmap[sorted[in].second] = sites_.size();
    }
    sites_.push_back(site);
  }
  input_vertices_ = sites_;
  for (InputEdge& e : input_edges_) {
    e.first = vmap[e.first];
    e.second = vmap[e.second];
  }
}